

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

void __thiscall CVmObjBigNum::set_ieee754_value(CVmObjBigNum *this,char *buf,int bits)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  byte bVar5;
  int i;
  char *new_ext;
  char *pcVar6;
  ieee754 val;
  char t3buf [42];
  char t1 [42];
  char t2buf [42];
  
  ieee754::ieee754(&val,buf,bits);
  iVar2 = ieee754::is_zero(&val);
  if (iVar2 == 0) {
    iVar2 = ieee754::is_nan(&val);
    if (iVar2 != 0) {
      pcVar4 = (this->super_CVmObject).ext_;
      bVar5 = pcVar4[4] & 0xf9U | 2;
      goto LAB_0025d3a6;
    }
    iVar2 = ieee754::is_infinity(&val);
    if (iVar2 == 0) {
      iVar2 = ieee754::decimal_digits(&val);
      t1[8] = '\0';
      t1[9] = '\0';
      t1[10] = '\0';
      t1[0xb] = '\0';
      t1[0xc] = '\0';
      t1[0xd] = '\0';
      t1[0xe] = '\0';
      t1[0xf] = '\0';
      t1[0x20] = '\0';
      t1[0x21] = '\0';
      t1[0x22] = '\0';
      t1[0x23] = '\0';
      t1[0x24] = '\0';
      t1[0x25] = '\0';
      t1[0x26] = '\0';
      t1[0x27] = '\0';
      t1[0x28] = '\0';
      t1[0x29] = '\0';
      t1[0x10] = '\0';
      t1[0x11] = '\0';
      t1[0x12] = '\0';
      t1[0x13] = '\0';
      t1[0x14] = '\0';
      t1[0x15] = '\0';
      t1[0x16] = '\0';
      t1[0x17] = '\0';
      t1[0x18] = '\0';
      t1[0x19] = '\0';
      t1[0x1a] = '\0';
      t1[0x1b] = '\0';
      t1[0x1c] = '\0';
      t1[0x1d] = '\0';
      t1[0x1e] = '\0';
      t1[0x1f] = '\0';
      t1[0] = (char)(iVar2 + 2);
      t1[1] = '\0';
      t1[2] = '\0';
      t1[3] = '\0';
      t1[4] = '\0';
      t1[5] = '\0';
      t1[6] = '\0';
      t1[7] = '\0';
      t2buf[8] = '\0';
      t2buf[9] = '\0';
      t2buf[10] = '\0';
      t2buf[0xb] = '\0';
      t2buf[0xc] = '\0';
      t2buf[0xd] = '\0';
      t2buf[0xe] = '\0';
      t2buf[0xf] = '\0';
      t2buf[0x20] = '\0';
      t2buf[0x21] = '\0';
      t2buf[0x22] = '\0';
      t2buf[0x23] = '\0';
      t2buf[0x24] = '\0';
      t2buf[0x25] = '\0';
      t2buf[0x26] = '\0';
      t2buf[0x27] = '\0';
      t2buf[0x28] = '\0';
      t2buf[0x29] = '\0';
      t2buf[0x10] = '\0';
      t2buf[0x11] = '\0';
      t2buf[0x12] = '\0';
      t2buf[0x13] = '\0';
      t2buf[0x14] = '\0';
      t2buf[0x15] = '\0';
      t2buf[0x16] = '\0';
      t2buf[0x17] = '\0';
      t2buf[0x18] = '\0';
      t2buf[0x19] = '\0';
      t2buf[0x1a] = '\0';
      t2buf[0x1b] = '\0';
      t2buf[0x1c] = '\0';
      t2buf[0x1d] = '\0';
      t2buf[0x1e] = '\0';
      t2buf[0x1f] = '\0';
      t2buf[1] = '\0';
      t2buf[2] = '\0';
      t2buf[3] = '\0';
      t2buf[4] = '\0';
      t2buf[5] = '\0';
      t2buf[6] = '\0';
      t2buf[7] = '\0';
      t2buf[0] = t1[0];
      t3buf[8] = '\0';
      t3buf[9] = '\0';
      t3buf[10] = '\0';
      t3buf[0xb] = '\0';
      t3buf[0xc] = '\0';
      t3buf[0xd] = '\0';
      t3buf[0xe] = '\0';
      t3buf[0xf] = '\0';
      t3buf[0x20] = '\0';
      t3buf[0x21] = '\0';
      t3buf[0x22] = '\0';
      t3buf[0x23] = '\0';
      t3buf[0x24] = '\0';
      t3buf[0x25] = '\0';
      t3buf[0x26] = '\0';
      t3buf[0x27] = '\0';
      t3buf[0x28] = '\0';
      t3buf[0x29] = '\0';
      t3buf[0x10] = '\0';
      t3buf[0x11] = '\0';
      t3buf[0x12] = '\0';
      t3buf[0x13] = '\0';
      t3buf[0x14] = '\0';
      t3buf[0x15] = '\0';
      t3buf[0x16] = '\0';
      t3buf[0x17] = '\0';
      t3buf[0x18] = '\0';
      t3buf[0x19] = '\0';
      t3buf[0x1a] = '\0';
      t3buf[0x1b] = '\0';
      t3buf[0x1c] = '\0';
      t3buf[0x1d] = '\0';
      t3buf[0x1e] = '\0';
      t3buf[0x1f] = '\0';
      t3buf[1] = '\0';
      t3buf[2] = '\0';
      t3buf[3] = '\0';
      t3buf[4] = '\0';
      t3buf[5] = '\0';
      t3buf[6] = '\0';
      t3buf[7] = '\0';
      t3buf[0] = t1[0];
      pcVar4 = cache_ln2((long)(iVar2 + 2));
      iVar2 = ieee754::get_exp(&val);
      set_int_val(t1,(long)iVar2);
      compute_prod_into(t2buf,t1,pcVar4);
      compute_exp_into(t1,t2buf);
      uVar1 = t3buf._0_8_;
      if (iVar2 < val.emin) {
        t3buf[2] = '\x01';
        t3buf[3] = '\0';
        t3buf._5_3_ = SUB83(uVar1,5);
        t3buf[4] = '\b';
        memset(t3buf + 5,0,(ulong)((ushort)t3buf._0_2_ + 1 >> 1));
        mul_by_long(t1,2);
      }
      else {
        copy_val(t3buf,t1,0);
      }
      pcVar4 = t3buf;
      new_ext = t2buf;
      for (iVar2 = 0; iVar2 < val.mbits; iVar2 = iVar2 + 1) {
        div_by_long(t1,2,(unsigned_long *)0x0);
        iVar3 = ieee754::get_mbit(&val,iVar2);
        pcVar6 = new_ext;
        if (iVar3 != 0) {
          compute_sum_into(new_ext,pcVar4,t1);
          pcVar6 = pcVar4;
          pcVar4 = new_ext;
        }
        new_ext = pcVar6;
      }
      pcVar4[4] = val.buf[(long)val.bytes + -1] >> 7 | pcVar4[4] & 0xfeU;
      normalize(pcVar4);
      copy_val((this->super_CVmObject).ext_,pcVar4,1);
      return;
    }
    pcVar4 = (this->super_CVmObject).ext_;
    pcVar4[4] = pcVar4[4] & 0xf9U | 4;
  }
  else {
    set_zero((this->super_CVmObject).ext_);
  }
  pcVar4 = (this->super_CVmObject).ext_;
  bVar5 = val.buf[(long)val.bytes + -1] >> 7 | pcVar4[4] & 0xfeU;
LAB_0025d3a6:
  pcVar4[4] = bVar5;
  return;
}

Assistant:

void CVmObjBigNum::set_ieee754_value(VMG_ const char *buf, int bits)
{
    /* set up the buffer descriptor */
    ieee754 val((char *)buf, bits);

    /* check for special values */
    if (val.is_zero())
    {
        set_zero(ext_);
        set_neg(ext_, val.get_sign());
        return;
    }
    else if (val.is_nan())
    {
        set_type(ext_, VMBN_T_NAN);
        return;
    }
    else if (val.is_infinity())
    {
        set_type(ext_, VMBN_T_INF);
        set_neg(ext_, val.get_sign());
        return;
    }

    /* 
     *   figure the precision for our intermediate calculations based on the
     *   precision of the source format in decimal digits 
     */
    int prec = val.decimal_digits() + 2;

    /* 
     *   Set up some registers for intermediate calculations.  We don't have
     *   to allocate these since we know the upper bound to the precision
     *   we'll need (namely 35+2 for the 128-bit type).  
     */
    char t1[5+37] = { (char)prec, 0, 0, 0, 0 };
    char t2buf[5+37] = { (char)prec, 0, 0, 0, 0 }, *t2 = t2buf;
    char t3buf[5+37] = { (char)prec, 0, 0, 0, 0 }, *t3 = t3buf;

    /*
     *   The IEEE value is represented as A * 2^B, for some non-zero value of
     *   A.  If the exponent is emin-1, A is represented as 0.bbbbb, where
     *   the b's are bits of the mantissa.  For any other exponent, A is
     *   represented as 1.bbbbb.  To compute our value, then, start with 2^B
     *   in register t1 and zero in the accumulator.  If the leading bit is 1
     *   (exponent >= emin), add r1 to the accumulator.  Divide t1 by 2 and
     *   loop: if the current bit is set, add t1 to the accumulator.  Repeat
     *   for each bit of the mantissa.  
     */
    
    /* calculate t1 = 2^B = e^(B*ln2) */
    const char *ln2 = cache_ln2(prec);
    int e = val.get_exp();
    set_int_val(t1, e);
    compute_prod_into(t2, t1, ln2);
    compute_exp_into(t1, t2);

    /* 
     *   If b > emin-1, there's an implied 1 bit for the whole part.  If b ==
     *   emin-1, we have a subnormal number, meaning that the implied lead
     *   bit is 0, and the actual exponent is val.emin.  
     */
    if (e > val.emin - 1)
    {
        /* normalized - add the implied leading "1" bit */
        copy_val(t3, t1, FALSE);
    }
    else
    {
        /* 
         *   subnormal - the implied leading bit is "0", but the actual
         *   exponent value is emin - one higher than it appears
         */
        set_zero(t3);
        mul_by_long(t1, 2);
    }

    /* add each bit of the mantissa */
    for (int i = 0 ; i < val.mbits ; ++i)
    {
        /* divide the power-of-two multiplier by 2 for the next lower place */
        div_by_long(t1, 2);

        /* if this mantissa bit is 1, add t1 to the accumulator */
        if (val.get_mbit(i))
        {
            /* t2 <- acc + power of two */
            compute_sum_into(t2, t3, t1);

            /* swap t2 and t3 so that t3 is the accumulator again */
            char *ttmp = t3; t3 = t2; t2 = ttmp;
        }
    }

    /* set the sign and normalize the value */
    set_neg(t3, val.get_sign());
    normalize(t3);

    /* copy the result into our extension */
    copy_val(ext_, t3, TRUE);
}